

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O2

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<double> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double __y;
  double theta;
  double dVar3;
  double objective_amplifier;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  init_policy_type iVar6;
  context *this_00;
  bool bVar7;
  int iVar8;
  int iVar9;
  rep rVar10;
  random_engine *rng;
  int iVar11;
  bit_array *x_optimistic;
  bit_array *x_pessimistic;
  int in_R9D;
  long i;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int local_184;
  bit_array x;
  double local_170;
  bit_array empty_x;
  quadratic_cost_type<double> norm_costs;
  compute_order compute;
  solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  slv;
  undefined1 extraout_var [56];
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  bit_array_impl::bit_array_impl(&x.super_bit_array_impl,variables);
  this_00 = this->m_ctx;
  normalize_costs<double,baryonyx::itm::quadratic_cost_type<double>>
            (&norm_costs,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<double> *)this->m_rng,(random_engine *)(ulong)(uint)variables,
             in_R9D);
  dVar1 = (this_00->parameters).kappa_step;
  local_170 = (this_00->parameters).delta;
  dVar2 = (this_00->parameters).kappa_max;
  __y = (this_00->parameters).alpha;
  theta = (this_00->parameters).theta;
  if (local_170 < 0.0) {
    local_170 = compute_delta<double,baryonyx::itm::quadratic_cost_type<double>>
                          (this->m_ctx,&norm_costs,theta,variables);
  }
  dVar13 = (this_00->parameters).w;
  dVar3 = (this_00->parameters).pushing_k_factor;
  objective_amplifier = (this_00->parameters).pushing_objective_amplifier;
  solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  ::solver_inequalities_01coeff
            (&slv,this->m_rng,
             (int)(((long)(constraints->
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(constraints->
                         super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x28),variables,&norm_costs,
             constraints);
  compute_order::compute_order(&compute,(this_00->parameters).order,variables);
  dVar14 = (this->m_ctx->parameters).init_policy_random;
  empty_x.super_bit_array_impl.m_size = 0;
  empty_x.super_bit_array_impl.m_block_size = 0;
  empty_x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar6 = (this_00->parameters).init_policy;
  if (iVar6 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
              (&x,original_costs,variables,0);
  }
  else {
    if (iVar6 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &x;
      x_optimistic = &empty_x;
    }
    else {
      if (iVar6 != optimistic_solve) goto LAB_003703ed;
      rng = this->m_rng;
      x_pessimistic = &empty_x;
      x_optimistic = &x;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<double>,baryonyx::itm::minimize_tag>
              (x_pessimistic,x_optimistic,rng,original_costs,constraints,1.0);
  }
LAB_003703ed:
  for (iVar11 = 0; x.super_bit_array_impl.m_size != iVar11; iVar11 = iVar11 + 1) {
    dVar12 = std::
             generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (this->m_rng);
    if (dVar12 < dVar14) {
      bit_array_impl::invert(&x.super_bit_array_impl,iVar11);
    }
  }
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            (&empty_x.super_bit_array_impl.m_data);
  dVar14 = (this_00->parameters).kappa_min;
  rVar10 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar10;
  rVar10 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar10;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array>
            (&compute,&slv,&x);
  iVar11 = 0x7fffffff;
  for (i = 0; i != (this_00->parameters).limit; i = i + 1) {
    iVar8 = compute_order::
            run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                      (&compute,&slv,&x,this->m_rng,dVar14,local_170,theta);
    if (iVar8 == 0) {
      dVar13 = quadratic_cost_type<double>::results(original_costs,&x,cost_constant);
      store_if_better(this,&x,dVar13,i);
      auVar17 = ZEXT864((ulong)dVar14);
      iVar11 = 0;
      local_184 = 0;
      goto LAB_0037060f;
    }
    if (iVar8 < iVar11) {
      store_if_better(this,&x,iVar8,i);
      iVar11 = iVar8;
    }
    if ((long)dVar13 < i) {
      auVar16._0_8_ = pow((double)iVar8 / (double)slv.m,__y);
      auVar16._8_56_ = extraout_var;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar14;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar1;
      auVar15 = vfmadd231sd_fma(auVar18,auVar16._0_16_,auVar4);
      dVar14 = auVar15._0_8_;
    }
    if ((dVar2 < dVar14) || (bVar7 = is_timelimit_reached(this), bVar7)) break;
  }
  __return_storage_ptr__->status = limit_reached;
LAB_00370544:
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,variables);
  }
  compute_order::~compute_order(&compute);
  solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
  ::~solver_inequalities_01coeff(&slv);
  quadratic_cost_type<double>::~quadratic_cost_type(&norm_costs);
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            (&x.super_bit_array_impl.m_data);
  return __return_storage_ptr__;
LAB_0037060f:
  if ((this_00->parameters).pushes_limit <= iVar11) goto LAB_00370544;
  dVar13 = auVar17._0_8_;
  iVar8 = compute_order::
          push_and_run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                    (&compute,&slv,&x,this->m_rng,dVar13 * dVar3,local_170,theta,objective_amplifier
                    );
  if (iVar8 == 0) {
    dVar14 = quadratic_cost_type<double>::results(original_costs,&x,cost_constant);
    store_if_better(this,&x,dVar14,(long)~((this_00->parameters).pushing_iteration_limit * iVar11));
  }
  bVar7 = is_timelimit_reached(this);
  if (bVar7) goto LAB_00370544;
  iVar8 = 1;
  while( true ) {
    auVar17 = ZEXT864((ulong)dVar13);
    if ((this_00->parameters).pushing_iteration_limit <= iVar8 + -1) break;
    iVar9 = compute_order::
            run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array,double>
                      (&compute,&slv,&x,this->m_rng,dVar13,local_170,theta);
    if (iVar9 == 0) {
      dVar14 = quadratic_cost_type<double>::results(original_costs,&x,cost_constant);
      store_if_better(this,&x,dVar14,
                      (long)((this_00->parameters).pushing_iteration_limit * local_184 - iVar8));
      auVar17 = ZEXT864((ulong)dVar13);
      break;
    }
    if ((double)(iVar8 + -1) <= (this_00->parameters).w) {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar13;
    }
    else {
      auVar17._0_8_ = pow((double)iVar9 / (double)slv.m,__y);
      auVar17._8_56_ = extraout_var_00;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar13;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar1;
      auVar15 = vfmadd231sd_fma(auVar19,auVar17._0_16_,auVar5);
    }
    auVar17 = ZEXT1664(auVar15);
    dVar13 = auVar15._0_8_;
    if (dVar2 < dVar13) break;
    bVar7 = is_timelimit_reached(this);
    if (bVar7) {
      auVar17 = ZEXT864((ulong)dVar13);
      break;
    }
    iVar8 = iVar8 + 1;
  }
  local_184 = local_184 + -1;
  iVar11 = iVar11 + 1;
  goto LAB_0037060f;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }